

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  long lVar6;
  cmUVProcessChainBuilder *this;
  ostream *poVar7;
  bool local_389;
  undefined1 local_358 [8];
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  Status *status;
  cmUVProcessChain chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  cmUVProcessChainBuilder builder;
  undefined1 local_2a0 [4];
  int result;
  string command;
  undefined1 local_278 [8];
  ifstream fin;
  string local_60 [32];
  string_view local_40;
  string_view local_30;
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool verbose;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_19 = 0;
  pvStack_18 = args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (3 < sVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,3);
    local_30 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
    bVar1 = cmHasLiteralPrefix<11ul>(local_30,(char (*) [11])"--verbose=");
    if (bVar1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,3);
      std::__cxx11::string::substr((ulong)local_60,(ulong)pvVar4);
      local_40 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_60);
      bVar1 = cmIsOff(local_40);
      std::__cxx11::string::~string(local_60);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_19 = 1;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](pvStack_18,2);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_278,pcVar5,_S_in);
  bVar2 = std::ios::operator!((ios *)(local_278 + (long)*(_func_int **)((long)local_278 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_2a0);
    builder.Loop._4_4_ = 0;
    while( true ) {
      local_389 = false;
      if (builder.Loop._4_4_ == 0) {
        local_389 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_278,(string *)local_2a0,(bool *)0x0,
                               0xffffffffffffffff);
      }
      if (local_389 == false) break;
      lVar6 = std::__cxx11::string::find_first_not_of(local_2a0,0xfe3e4c);
      if (lVar6 != -1) {
        cmUVProcessChainBuilder::cmUVProcessChainBuilder
                  ((cmUVProcessChainBuilder *)
                   &args2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this = cmUVProcessChainBuilder::SetExternalStream
                         ((cmUVProcessChainBuilder *)
                          &args2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,Stream_OUTPUT,_stdout)
        ;
        cmUVProcessChainBuilder::SetExternalStream(this,Stream_ERROR,_stderr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&chain);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::ParseUnixCommandLine
                  (pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&chain);
        cmUVProcessChainBuilder::AddCommand
                  ((cmUVProcessChainBuilder *)
                   &args2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&chain);
        if ((local_19 & 1) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_2a0);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&status);
        cmUVProcessChain::Wait((cmUVProcessChain *)&status,0);
        exception.second.field_2._8_8_ = cmUVProcessChain::GetStatus((cmUVProcessChain *)&status,0);
        cmUVProcessChain::Status::GetException_abi_cxx11_
                  ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_358,(Status *)exception.second.field_2._8_8_);
        if (local_358._0_4_ == None) {
          if (*(long *)(exception.second.field_2._8_8_ + 8) != 0) {
            builder.Loop._4_4_ = (int)*(undefined8 *)(exception.second.field_2._8_8_ + 8);
          }
        }
        else if (local_358._0_4_ == Spawn) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
          std::operator<<(poVar7,(string *)&exception);
          builder.Loop._4_4_ = 2;
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
          std::operator<<(poVar7,(string *)&exception);
          builder.Loop._4_4_ = 1;
        }
        std::
        pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_358);
        cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)&status);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&chain);
        cmUVProcessChainBuilder::~cmUVProcessChainBuilder
                  ((cmUVProcessChainBuilder *)
                   &args2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    args_local._4_4_ = builder.Loop._4_4_;
    command.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_2a0);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error opening link script \"");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,2);
    poVar7 = std::operator<<(poVar7,(string *)pvVar4);
    poVar7 = std::operator<<(poVar7,"\"");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    args_local._4_4_ = 1;
    command.field_2._12_4_ = 1;
  }
  std::ifstream::~ifstream(local_278);
  return args_local._4_4_;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string> const& args)
{
  // The arguments are
  //   args[0] == <cmake-executable>
  //   args[1] == cmake_link_script
  //   args[2] == <link-script-name>
  //   args[3] == --verbose=?
  bool verbose = false;
  if (args.size() >= 4) {
    if (cmHasLiteralPrefix(args[3], "--verbose=")) {
      if (!cmIsOff(args[3].substr(10))) {
        verbose = true;
      }
    }
  }

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if (!fin) {
    std::cerr << "Error opening link script \"" << args[2] << "\""
              << std::endl;
    return 1;
  }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while (result == 0 && cmSystemTools::GetLineFromStream(fin, command)) {
    // Skip empty command lines.
    if (command.find_first_not_of(" \t") == std::string::npos) {
      continue;
    }

    // Allocate a process instance.
    cmUVProcessChainBuilder builder;

    // Children should share stdout and stderr with this process.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);

    // Setup this command line.
    std::vector<std::string> args2;
#ifdef _WIN32
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), args2);
#else
    cmSystemTools::ParseUnixCommandLine(command.c_str(), args2);
#endif
    builder.AddCommand(args2);

    // Report the command if verbose output is enabled.
    if (verbose) {
      std::cout << command << std::endl;
    }

    // Run the command and wait for it to exit.
    auto chain = builder.Start();
    chain.Wait();

    // Report failure if any.
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (status.ExitStatus != 0) {
          result = static_cast<int>(status.ExitStatus);
        }
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        std::cerr << "Error running link command: " << exception.second;
        result = 2;
        break;
      default:
        std::cerr << "Error running link command: " << exception.second;
        result = 1;
        break;
    }
  }

  // Return the final resulting return value.
  return result;
}